

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

void __thiscall duckdb_mbedtls::MbedTlsWrapper::SHA256State::FinishHex(SHA256State *this,char *out)

{
  int iVar1;
  runtime_error *this_00;
  char *in;
  char *in_RSI;
  uchar *in_RDI;
  string hash;
  mbedtls_sha256_context *context;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  mbedtls_sha256_context *ctx;
  undefined1 local_38 [56];
  
  local_38._32_8_ = *(undefined8 *)in_RDI;
  ctx = (mbedtls_sha256_context *)local_38;
  local_38._40_8_ = in_RSI;
  std::__cxx11::string::string((string *)ctx);
  std::__cxx11::string::resize((ulong)ctx);
  std::__cxx11::string::data();
  iVar1 = mbedtls_sha256_finish
                    (ctx,(uchar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"SHA256 Error");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  in = (char *)std::__cxx11::string::c_str();
  ToBase16(in,(char *)local_38._40_8_,0x20);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void MbedTlsWrapper::SHA256State::FinishHex(char *out) {
	auto context = reinterpret_cast<mbedtls_sha256_context *>(sha_context);

	string hash;
	hash.resize(MbedTlsWrapper::SHA256_HASH_LENGTH_BYTES);

	if (mbedtls_sha256_finish(context, (unsigned char *)hash.data())) {
		throw std::runtime_error("SHA256 Error");
	}

	MbedTlsWrapper::ToBase16(const_cast<char *>(hash.c_str()), out, MbedTlsWrapper::SHA256_HASH_LENGTH_BYTES);
}